

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O1

void __thiscall QPDFJob::doJSONPageLabels(QPDFJob *this,Pipeline *p,bool *first,QPDF *pdf)

{
  element_type *peVar1;
  bool bVar2;
  unsigned_long i;
  pointer pQVar3;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> labels;
  JSON j_labels;
  JSON j_label;
  QPDFPageLabelDocumentHelper pldh;
  undefined1 local_f8 [32];
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_d8;
  QPDFJob *local_b8;
  QPDFObjectHandle local_b0;
  JSON local_a0;
  Pipeline *local_90;
  bool *local_88;
  undefined1 local_80 [48];
  JSON local_50;
  JSON local_40;
  
  local_b8 = this;
  local_90 = p;
  local_88 = first;
  JSON::makeArray();
  QPDFPageLabelDocumentHelper::QPDFPageLabelDocumentHelper
            ((QPDFPageLabelDocumentHelper *)(local_80 + 0x10),pdf);
  QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_f8,pdf);
  QPDFPageDocumentHelper::getAllPages
            ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&local_d8,
             (QPDFPageDocumentHelper *)local_f8);
  i = ((long)local_d8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)local_d8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
  if ((long)local_d8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl
            .super__Vector_impl_data._M_finish -
      (long)local_d8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl
            .super__Vector_impl_data._M_start < 0) {
    QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::error(i);
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
            ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&local_d8);
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_f8);
  bVar2 = QPDFPageLabelDocumentHelper::hasPageLabels
                    ((QPDFPageLabelDocumentHelper *)(local_80 + 0x10));
  if (bVar2) {
    local_d8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    QPDFPageLabelDocumentHelper::getLabelsForPageRange
              ((QPDFPageLabelDocumentHelper *)(local_80 + 0x10),0,i - 1,0,&local_d8);
    if (local_d8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_d8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      peVar1 = (element_type *)(local_f8 + 0x10);
      pQVar3 = local_d8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
               _M_impl.super__Vector_impl_data._M_start;
      do {
        if (pQVar3 + 1 ==
            local_d8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl
            .super__Vector_impl_data._M_finish) break;
        JSON::makeDictionary();
        JSON::addArrayElement((JSON *)local_80,&local_a0);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
        }
        local_f8._0_8_ = peVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"index","");
        QPDFObjectHandle::getJSON
                  (&local_b0,(int)pQVar3,
                   SUB41(((local_b8->m).
                          super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         json_version,0));
        JSON::addDictionaryMember(&local_40,(string *)local_80,(JSON *)local_f8);
        if (local_40.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_40.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_b0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_b0.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        if ((element_type *)local_f8._0_8_ != peVar1) {
          operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
        }
        local_f8._0_8_ = peVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"label","");
        QPDFObjectHandle::getJSON
                  (&local_b0,(int)(pQVar3 + 1),
                   SUB41(((local_b8->m).
                          super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         json_version,0));
        JSON::addDictionaryMember(&local_50,(string *)local_80,(JSON *)local_f8);
        if (local_50.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_50.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_b0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_b0.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        if ((element_type *)local_f8._0_8_ != peVar1) {
          operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
        }
        pQVar3 = pQVar3 + 2;
      } while (pQVar3 != local_d8.
                         super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
    }
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_d8);
  }
  local_f8._0_8_ = (element_type *)(local_f8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"pagelabels","");
  JSON::writeDictionaryItem(local_90,local_88,(string *)local_f8,&local_a0,1);
  if ((element_type *)local_f8._0_8_ != (element_type *)(local_f8 + 0x10)) {
    operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
  }
  QPDFPageLabelDocumentHelper::~QPDFPageLabelDocumentHelper
            ((QPDFPageLabelDocumentHelper *)(local_80 + 0x10));
  if (local_a0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

void
QPDFJob::doJSONPageLabels(Pipeline* p, bool& first, QPDF& pdf)
{
    JSON j_labels = JSON::makeArray();
    QPDFPageLabelDocumentHelper pldh(pdf);
    long long npages = QIntC::to_longlong(QPDFPageDocumentHelper(pdf).getAllPages().size());
    if (pldh.hasPageLabels()) {
        std::vector<QPDFObjectHandle> labels;
        pldh.getLabelsForPageRange(0, npages - 1, 0, labels);
        for (auto iter = labels.begin(); iter != labels.end(); ++iter) {
            if ((iter + 1) == labels.end()) {
                // This can't happen, so ignore it. This could only happen if getLabelsForPageRange
                // somehow returned an odd number of items.
                break;
            }
            JSON j_label = j_labels.addArrayElement(JSON::makeDictionary());
            j_label.addDictionaryMember("index", (*iter).getJSON(m->json_version));
            ++iter;
            j_label.addDictionaryMember("label", (*iter).getJSON(m->json_version));
        }
    }
    JSON::writeDictionaryItem(p, first, "pagelabels", j_labels, 1);
}